

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qAverageColor.cpp
# Opt level: O3

uint32_t AverageColorRGBA8(uint32_t *Pixels,size_t Count)

{
  byte bVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [32];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar11 [32];
  
  if (Count == 0) {
    uVar10 = 0;
    uVar9 = 0;
    uVar8 = 0;
    uVar7 = 0;
  }
  else {
    auVar14 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar13._8_4_ = 0xff;
    auVar13._0_8_ = 0xff000000ff;
    auVar13._12_4_ = 0xff;
    auVar13._16_4_ = 0xff;
    auVar13._20_4_ = 0xff;
    auVar13._24_4_ = 0xff;
    auVar13._28_4_ = 0xff;
    auVar21 = ZEXT1664((undefined1  [16])0x0);
    auVar23 = ZEXT1664((undefined1  [16])0x0);
    auVar24 = ZEXT1664((undefined1  [16])0x0);
    auVar25 = ZEXT1664((undefined1  [16])0x0);
    auVar15 = vpbroadcastq_avx512f();
    uVar7 = 0;
    do {
      auVar16 = vpbroadcastq_avx512f();
      auVar17 = vmovdqa64_avx512f(auVar21);
      auVar18 = vmovdqa64_avx512f(auVar25);
      auVar19 = vmovdqa64_avx512f(auVar24);
      auVar20 = vmovdqa64_avx512f(auVar23);
      auVar23 = vporq_avx512f(auVar16,auVar14);
      uVar8 = vpcmpuq_avx512f(auVar23,auVar15,2);
      auVar11 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(Pixels + uVar7));
      bVar1 = (byte)uVar8;
      auVar12._4_4_ = (uint)((byte)(uVar8 >> 1) & 1) * auVar11._4_4_;
      auVar12._0_4_ = (uint)(bVar1 & 1) * auVar11._0_4_;
      auVar12._8_4_ = (uint)((byte)(uVar8 >> 2) & 1) * auVar11._8_4_;
      auVar12._12_4_ = (uint)((byte)(uVar8 >> 3) & 1) * auVar11._12_4_;
      auVar12._16_4_ = (uint)((byte)(uVar8 >> 4) & 1) * auVar11._16_4_;
      auVar12._20_4_ = (uint)((byte)(uVar8 >> 5) & 1) * auVar11._20_4_;
      auVar12._24_4_ = (uint)((byte)(uVar8 >> 6) & 1) * auVar11._24_4_;
      auVar12._28_4_ = (uint)(byte)(uVar8 >> 7) * auVar11._28_4_;
      uVar7 = uVar7 + 8;
      auVar5 = vpshufb_avx2(auVar12,_DAT_00102100);
      auVar6 = vpshufb_avx2(auVar12,_DAT_00102120);
      auVar22 = vpsrld_avx2(auVar12,0x18);
      auVar11 = vpand_avx2(auVar12,auVar13);
      auVar23 = vpmovzxdq_avx512f(auVar22);
      auVar21 = vpmovzxdq_avx512f(auVar11);
      auVar24 = vpmovzxdq_avx512f(auVar5);
      auVar25 = vpmovzxdq_avx512f(auVar6);
      auVar23 = vpaddq_avx512f(auVar20,auVar23);
      auVar21 = vpaddq_avx512f(auVar17,auVar21);
      auVar24 = vpaddq_avx512f(auVar19,auVar24);
      auVar25 = vpaddq_avx512f(auVar18,auVar25);
    } while ((Count + 7 & 0xfffffffffffffff8) != uVar7);
    auVar14 = vmovdqa64_avx512f(auVar21);
    auVar15._0_8_ = (ulong)(bVar1 & 1) * auVar14._0_8_ | (ulong)!(bool)(bVar1 & 1) * auVar17._0_8_;
    bVar2 = (bool)((byte)(uVar8 >> 1) & 1);
    auVar15._8_8_ = (ulong)bVar2 * auVar14._8_8_ | (ulong)!bVar2 * auVar17._8_8_;
    bVar2 = (bool)((byte)(uVar8 >> 2) & 1);
    auVar15._16_8_ = (ulong)bVar2 * auVar14._16_8_ | (ulong)!bVar2 * auVar17._16_8_;
    bVar2 = (bool)((byte)(uVar8 >> 3) & 1);
    auVar15._24_8_ = (ulong)bVar2 * auVar14._24_8_ | (ulong)!bVar2 * auVar17._24_8_;
    bVar2 = (bool)((byte)(uVar8 >> 4) & 1);
    auVar15._32_8_ = (ulong)bVar2 * auVar14._32_8_ | (ulong)!bVar2 * auVar17._32_8_;
    bVar2 = (bool)((byte)(uVar8 >> 5) & 1);
    auVar15._40_8_ = (ulong)bVar2 * auVar14._40_8_ | (ulong)!bVar2 * auVar17._40_8_;
    bVar2 = (bool)((byte)(uVar8 >> 6) & 1);
    auVar15._48_8_ = (ulong)bVar2 * auVar14._48_8_ | (ulong)!bVar2 * auVar17._48_8_;
    auVar15._56_8_ = (uVar8 >> 7) * auVar14._56_8_ | (ulong)!SUB81(uVar8 >> 7,0) * auVar17._56_8_;
    auVar13 = vextracti64x4_avx512f(auVar15,1);
    auVar14 = vmovdqa64_avx512f(auVar23);
    auVar23._0_8_ = (ulong)(bVar1 & 1) * auVar14._0_8_ | (ulong)!(bool)(bVar1 & 1) * auVar20._0_8_;
    bVar2 = (bool)((byte)(uVar8 >> 1) & 1);
    auVar23._8_8_ = (ulong)bVar2 * auVar14._8_8_ | (ulong)!bVar2 * auVar20._8_8_;
    bVar2 = (bool)((byte)(uVar8 >> 2) & 1);
    auVar23._16_8_ = (ulong)bVar2 * auVar14._16_8_ | (ulong)!bVar2 * auVar20._16_8_;
    bVar2 = (bool)((byte)(uVar8 >> 3) & 1);
    auVar23._24_8_ = (ulong)bVar2 * auVar14._24_8_ | (ulong)!bVar2 * auVar20._24_8_;
    bVar2 = (bool)((byte)(uVar8 >> 4) & 1);
    auVar23._32_8_ = (ulong)bVar2 * auVar14._32_8_ | (ulong)!bVar2 * auVar20._32_8_;
    bVar2 = (bool)((byte)(uVar8 >> 5) & 1);
    auVar23._40_8_ = (ulong)bVar2 * auVar14._40_8_ | (ulong)!bVar2 * auVar20._40_8_;
    bVar2 = (bool)((byte)(uVar8 >> 6) & 1);
    auVar23._48_8_ = (ulong)bVar2 * auVar14._48_8_ | (ulong)!bVar2 * auVar20._48_8_;
    auVar23._56_8_ = (uVar8 >> 7) * auVar14._56_8_ | (ulong)!SUB81(uVar8 >> 7,0) * auVar20._56_8_;
    auVar14 = vmovdqa64_avx512f(auVar24);
    auVar21._0_8_ = (ulong)(bVar1 & 1) * auVar14._0_8_ | (ulong)!(bool)(bVar1 & 1) * auVar19._0_8_;
    bVar2 = (bool)((byte)(uVar8 >> 1) & 1);
    auVar21._8_8_ = (ulong)bVar2 * auVar14._8_8_ | (ulong)!bVar2 * auVar19._8_8_;
    bVar2 = (bool)((byte)(uVar8 >> 2) & 1);
    auVar21._16_8_ = (ulong)bVar2 * auVar14._16_8_ | (ulong)!bVar2 * auVar19._16_8_;
    bVar2 = (bool)((byte)(uVar8 >> 3) & 1);
    auVar21._24_8_ = (ulong)bVar2 * auVar14._24_8_ | (ulong)!bVar2 * auVar19._24_8_;
    bVar2 = (bool)((byte)(uVar8 >> 4) & 1);
    auVar21._32_8_ = (ulong)bVar2 * auVar14._32_8_ | (ulong)!bVar2 * auVar19._32_8_;
    bVar2 = (bool)((byte)(uVar8 >> 5) & 1);
    auVar21._40_8_ = (ulong)bVar2 * auVar14._40_8_ | (ulong)!bVar2 * auVar19._40_8_;
    bVar2 = (bool)((byte)(uVar8 >> 6) & 1);
    auVar21._48_8_ = (ulong)bVar2 * auVar14._48_8_ | (ulong)!bVar2 * auVar19._48_8_;
    auVar21._56_8_ = (uVar8 >> 7) * auVar14._56_8_ | (ulong)!SUB81(uVar8 >> 7,0) * auVar19._56_8_;
    auVar14 = vmovdqa64_avx512f(auVar25);
    auVar24._0_8_ = (ulong)(bVar1 & 1) * auVar14._0_8_ | (ulong)!(bool)(bVar1 & 1) * auVar18._0_8_;
    bVar2 = (bool)((byte)(uVar8 >> 1) & 1);
    auVar24._8_8_ = (ulong)bVar2 * auVar14._8_8_ | (ulong)!bVar2 * auVar18._8_8_;
    bVar2 = (bool)((byte)(uVar8 >> 2) & 1);
    auVar24._16_8_ = (ulong)bVar2 * auVar14._16_8_ | (ulong)!bVar2 * auVar18._16_8_;
    bVar2 = (bool)((byte)(uVar8 >> 3) & 1);
    auVar24._24_8_ = (ulong)bVar2 * auVar14._24_8_ | (ulong)!bVar2 * auVar18._24_8_;
    bVar2 = (bool)((byte)(uVar8 >> 4) & 1);
    auVar24._32_8_ = (ulong)bVar2 * auVar14._32_8_ | (ulong)!bVar2 * auVar18._32_8_;
    bVar2 = (bool)((byte)(uVar8 >> 5) & 1);
    auVar24._40_8_ = (ulong)bVar2 * auVar14._40_8_ | (ulong)!bVar2 * auVar18._40_8_;
    bVar2 = (bool)((byte)(uVar8 >> 6) & 1);
    auVar24._48_8_ = (ulong)bVar2 * auVar14._48_8_ | (ulong)!bVar2 * auVar18._48_8_;
    auVar24._56_8_ = (uVar8 >> 7) * auVar14._56_8_ | (ulong)!SUB81(uVar8 >> 7,0) * auVar18._56_8_;
    auVar14 = vpaddq_avx512f(auVar15,ZEXT3264(auVar13));
    auVar3 = vpaddq_avx(auVar14._0_16_,auVar14._16_16_);
    auVar4 = vpshufd_avx(auVar3,0xee);
    auVar3 = vpaddq_avx(auVar3,auVar4);
    uVar7 = auVar3._0_8_;
    auVar13 = vextracti64x4_avx512f(auVar23,1);
    auVar14 = vpaddq_avx512f(auVar23,ZEXT3264(auVar13));
    auVar3 = vpaddq_avx(auVar14._0_16_,auVar14._16_16_);
    auVar4 = vpshufd_avx(auVar3,0xee);
    auVar3 = vpaddq_avx(auVar3,auVar4);
    uVar8 = auVar3._0_8_;
    auVar13 = vextracti64x4_avx512f(auVar21,1);
    auVar14 = vpaddq_avx512f(auVar21,ZEXT3264(auVar13));
    auVar3 = vpaddq_avx(auVar14._0_16_,auVar14._16_16_);
    auVar4 = vpshufd_avx(auVar3,0xee);
    auVar3 = vpaddq_avx(auVar3,auVar4);
    uVar9 = auVar3._0_8_;
    auVar13 = vextracti64x4_avx512f(auVar24,1);
    auVar14 = vpaddq_avx512f(auVar24,ZEXT3264(auVar13));
    auVar3 = vpaddq_avx(auVar14._0_16_,auVar14._16_16_);
    auVar4 = vpshufd_avx(auVar3,0xee);
    auVar3 = vpaddq_avx(auVar3,auVar4);
    uVar10 = auVar3._0_8_;
  }
  return (int)(uVar8 / Count) << 0x18 | ((uint)(uVar9 / Count) & 0xff) << 0x10 |
         ((uint)(uVar10 / Count) & 0xff) << 8 | (uint)(uVar7 / Count) & 0xff;
}

Assistant:

std::uint32_t AverageColorRGBA8(
	const std::uint32_t Pixels[],
	std::size_t Count
)
{
	std::uint64_t RedSum, GreenSum, BlueSum, AlphaSum;
	RedSum = GreenSum = BlueSum = AlphaSum = 0;
	for( std::size_t i = 0; i < Count; ++i )
	{
		const std::uint32_t& CurColor = Pixels[i];
		AlphaSum += static_cast<std::uint8_t>( CurColor >> 24 );
		BlueSum  += static_cast<std::uint8_t>( CurColor >> 16 );
		GreenSum += static_cast<std::uint8_t>( CurColor >>  8 );
		RedSum   += static_cast<std::uint8_t>( CurColor >>  0 );
	}
	RedSum   /= Count;
	GreenSum /= Count;
	BlueSum  /= Count;
	AlphaSum /= Count;

	return
		(static_cast<std::uint32_t>( (std::uint8_t)AlphaSum ) << 24 ) |
		(static_cast<std::uint32_t>( (std::uint8_t) BlueSum ) << 16 ) |
		(static_cast<std::uint32_t>( (std::uint8_t)GreenSum ) <<  8 ) |
		(static_cast<std::uint32_t>( (std::uint8_t)  RedSum ) <<  0 );
}